

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk2dfd.c
# Opt level: O3

uint32_t * vk2dfd(VkFormat format)

{
  uint32_t *puVar1;
  int *channels_00;
  int *bits_00;
  int *piVar2;
  int iVar3;
  int iVar4;
  VkCompScheme compScheme;
  int iVar5;
  VkSuffix VVar6;
  int bits [2];
  int channels [2];
  int shiftBits [4];
  int position_ys [4];
  int position_xs [4];
  
  channels_00 = bits;
  piVar2 = bits;
  bits_00 = bits;
  puVar1 = (uint32_t *)0x0;
  if (0x3b9d2b5f < (int)format) {
    if (0x3b9ffa1f < (int)format) {
      if (0x3ba1de7f < (int)format) {
        if (format == VK_FORMAT_R16G16_S10_5_NV) {
          iVar5 = 2;
          iVar4 = 2;
          iVar3 = 0;
          VVar6 = s_SFIXED5;
          goto LAB_001e32c7;
        }
        if (format != VK_FORMAT_A1B5G5R5_UNORM_PACK16_KHR) {
          if (format != VK_FORMAT_A8_UNORM_KHR) {
            return (uint32_t *)0x0;
          }
          puVar1 = createDFDAlpha(0,1,s_UNORM);
          return puVar1;
        }
        channels[0] = 0;
        goto LAB_001e2536;
      }
      if (format == VK_FORMAT_A4R4G4B4_UNORM_PACK16) {
        channels[0] = 2;
        channels[1] = 1;
      }
      else {
        if (format != VK_FORMAT_A4B4G4R4_UNORM_PACK16) {
          return (uint32_t *)0x0;
        }
        channels[0] = 0;
        channels[1] = 1;
      }
      goto LAB_001e251e;
    }
    switch(format) {
    case VK_FORMAT_ASTC_3x3x3_UNORM_BLOCK_EXT:
      iVar5 = 3;
      goto LAB_001e3618;
    case VK_FORMAT_ASTC_3x3x3_SRGB_BLOCK_EXT:
      iVar5 = 3;
      goto LAB_001e363d;
    case VK_FORMAT_ASTC_3x3x3_SFLOAT_BLOCK_EXT:
      iVar5 = 3;
      goto LAB_001e367e;
    case VK_FORMAT_ASTC_4x3x3_UNORM_BLOCK_EXT:
      iVar5 = 4;
LAB_001e3618:
      iVar4 = 3;
LAB_001e36ac:
      compScheme = c_ASTC;
      iVar3 = 3;
      goto LAB_001e3110;
    case VK_FORMAT_ASTC_4x3x3_SRGB_BLOCK_EXT:
      iVar5 = 4;
LAB_001e363d:
      iVar4 = 3;
LAB_001e3642:
      compScheme = c_ASTC;
      iVar3 = 3;
      goto LAB_001e30b9;
    case VK_FORMAT_ASTC_4x3x3_SFLOAT_BLOCK_EXT:
      iVar5 = 4;
LAB_001e367e:
      iVar4 = 3;
LAB_001e36f7:
      compScheme = c_ASTC;
      iVar3 = 3;
      goto LAB_001e2de9;
    case VK_FORMAT_ASTC_4x4x3_UNORM_BLOCK_EXT:
      iVar5 = 4;
      iVar4 = 4;
      goto LAB_001e36ac;
    case VK_FORMAT_ASTC_4x4x3_SRGB_BLOCK_EXT:
      iVar5 = 4;
      iVar4 = 4;
      goto LAB_001e3642;
    case VK_FORMAT_ASTC_4x4x3_SFLOAT_BLOCK_EXT:
      iVar5 = 4;
      iVar4 = 4;
      goto LAB_001e36f7;
    case VK_FORMAT_ASTC_4x4x4_UNORM_BLOCK_EXT:
      iVar5 = 4;
      goto LAB_001e35b7;
    case VK_FORMAT_ASTC_4x4x4_SRGB_BLOCK_EXT:
      iVar5 = 4;
      goto LAB_001e36d9;
    case VK_FORMAT_ASTC_4x4x4_SFLOAT_BLOCK_EXT:
      iVar5 = 4;
      goto LAB_001e3588;
    case VK_FORMAT_ASTC_5x4x4_UNORM_BLOCK_EXT:
      iVar5 = 5;
LAB_001e35b7:
      iVar4 = 4;
LAB_001e3604:
      compScheme = c_ASTC;
      iVar3 = 4;
      goto LAB_001e3110;
    case VK_FORMAT_ASTC_5x4x4_SRGB_BLOCK_EXT:
      iVar5 = 5;
LAB_001e36d9:
      iVar4 = 4;
LAB_001e36de:
      compScheme = c_ASTC;
      iVar3 = 4;
      goto LAB_001e30b9;
    case VK_FORMAT_ASTC_5x4x4_SFLOAT_BLOCK_EXT:
      iVar5 = 5;
LAB_001e3588:
      iVar4 = 4;
LAB_001e365b:
      compScheme = c_ASTC;
      iVar3 = 4;
      goto LAB_001e2de9;
    case VK_FORMAT_ASTC_5x5x4_UNORM_BLOCK_EXT:
      iVar5 = 5;
      iVar4 = 5;
      goto LAB_001e3604;
    case VK_FORMAT_ASTC_5x5x4_SRGB_BLOCK_EXT:
      iVar5 = 5;
      iVar4 = 5;
      goto LAB_001e36de;
    case VK_FORMAT_ASTC_5x5x4_SFLOAT_BLOCK_EXT:
      iVar5 = 5;
      iVar4 = 5;
      goto LAB_001e365b;
    case VK_FORMAT_ASTC_5x5x5_UNORM_BLOCK_EXT:
      iVar5 = 5;
      goto LAB_001e36c0;
    case VK_FORMAT_ASTC_5x5x5_SRGB_BLOCK_EXT:
      iVar5 = 5;
      goto LAB_001e3717;
    case VK_FORMAT_ASTC_5x5x5_SFLOAT_BLOCK_EXT:
      iVar5 = 5;
      goto LAB_001e3730;
    case VK_FORMAT_ASTC_6x5x5_UNORM_BLOCK_EXT:
      iVar5 = 6;
LAB_001e36c0:
      iVar4 = 5;
LAB_001e36c5:
      compScheme = c_ASTC;
      iVar3 = 5;
      goto LAB_001e3110;
    case VK_FORMAT_ASTC_6x5x5_SRGB_BLOCK_EXT:
      iVar5 = 6;
LAB_001e3717:
      iVar4 = 5;
LAB_001e371c:
      compScheme = c_ASTC;
      iVar3 = 5;
      goto LAB_001e30b9;
    case VK_FORMAT_ASTC_6x5x5_SFLOAT_BLOCK_EXT:
      iVar5 = 6;
LAB_001e3730:
      iVar4 = 5;
LAB_001e3778:
      compScheme = c_ASTC;
      iVar3 = 5;
      goto LAB_001e2de9;
    case VK_FORMAT_ASTC_6x6x5_UNORM_BLOCK_EXT:
      iVar5 = 6;
      iVar4 = 6;
      goto LAB_001e36c5;
    case VK_FORMAT_ASTC_6x6x5_SRGB_BLOCK_EXT:
      iVar5 = 6;
      iVar4 = 6;
      goto LAB_001e371c;
    case VK_FORMAT_ASTC_6x6x5_SFLOAT_BLOCK_EXT:
      iVar5 = 6;
      iVar4 = 6;
      goto LAB_001e3778;
    case VK_FORMAT_ASTC_6x6x6_UNORM_BLOCK_EXT:
      compScheme = c_ASTC;
      iVar5 = 6;
      iVar4 = 6;
      iVar3 = 6;
      goto LAB_001e3110;
    case VK_FORMAT_ASTC_6x6x6_SRGB_BLOCK_EXT:
      compScheme = c_ASTC;
      iVar5 = 6;
      iVar4 = 6;
      iVar3 = 6;
      goto LAB_001e30b9;
    case VK_FORMAT_ASTC_6x6x6_SFLOAT_BLOCK_EXT:
      compScheme = c_ASTC;
      iVar5 = 6;
      iVar4 = 6;
      iVar3 = 6;
      goto LAB_001e2de9;
    }
    switch(format) {
    case VK_FORMAT_G8B8G8R8_422_UNORM:
      bits[0] = 8;
      bits[1] = 8;
      goto LAB_001e34bd;
    case VK_FORMAT_B8G8R8G8_422_UNORM:
      bits[0] = 8;
      bits[1] = 8;
      goto LAB_001e33a8;
    default:
      return (uint32_t *)0x0;
    case VK_FORMAT_R10X6_UNORM_PACK16:
      bits[0] = 10;
      shiftBits[0] = 6;
      goto LAB_001e33d3;
    case VK_FORMAT_R10X6G10X6_UNORM_2PACK16:
      bits[0] = 10;
      bits[1] = 10;
      shiftBits[0] = 6;
      shiftBits[1] = 6;
      goto LAB_001e3492;
    case VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16:
      bits[0] = 10;
      bits[1] = 10;
      shiftBits[0] = 6;
      shiftBits[1] = 6;
      shiftBits[2] = 6;
      shiftBits[3] = 6;
      goto LAB_001e3529;
    case VK_FORMAT_G10X6B10X6G10X6R10X6_422_UNORM_4PACK16:
      bits[0] = 10;
      bits[1] = 10;
      shiftBits[0] = 6;
      shiftBits[1] = 6;
      shiftBits[2] = 6;
      shiftBits[3] = 6;
      break;
    case VK_FORMAT_B10X6G10X6R10X6G10X6_422_UNORM_4PACK16:
      bits[0] = 10;
      bits[1] = 10;
      shiftBits[0] = 6;
      shiftBits[1] = 6;
      shiftBits[2] = 6;
      shiftBits[3] = 6;
      goto LAB_001e342c;
    case VK_FORMAT_R12X4_UNORM_PACK16:
      bits[0] = 0xc;
      shiftBits[0] = 4;
LAB_001e33d3:
      channels = (int  [2])((ulong)channels & 0xffffffff00000000);
      iVar3 = 1;
LAB_001e3538:
      puVar1 = createDFDPackedShifted(0,iVar3,bits,shiftBits,channels,s_UNORM);
      return puVar1;
    case VK_FORMAT_R12X4G12X4_UNORM_2PACK16:
      bits[0] = 0xc;
      bits[1] = 0xc;
      shiftBits[0] = 4;
      shiftBits[1] = 4;
LAB_001e3492:
      channels[0] = 0;
      channels[1] = 1;
      iVar3 = 2;
      goto LAB_001e3538;
    case VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16:
      bits[0] = 0xc;
      bits[1] = 0xc;
      shiftBits[0] = 4;
      shiftBits[1] = 4;
      shiftBits[2] = 4;
      shiftBits[3] = 4;
LAB_001e3529:
      channels[0] = 0;
      channels[1] = 1;
      iVar3 = 4;
      goto LAB_001e3538;
    case VK_FORMAT_G12X4B12X4G12X4R12X4_422_UNORM_4PACK16:
      bits[0] = 0xc;
      bits[1] = 0xc;
      shiftBits[0] = 4;
      shiftBits[1] = 4;
      shiftBits[2] = 4;
      shiftBits[3] = 4;
      break;
    case VK_FORMAT_B12X4G12X4R12X4G12X4_422_UNORM_4PACK16:
      bits[0] = 0xc;
      bits[1] = 0xc;
      shiftBits[0] = 4;
      shiftBits[1] = 4;
      shiftBits[2] = 4;
      shiftBits[3] = 4;
      goto LAB_001e342c;
    case VK_FORMAT_G16B16G16R16_422_UNORM:
      bits[0] = 0x10;
      bits[1] = 0x10;
LAB_001e34bd:
      shiftBits[0] = 0;
      shiftBits[1] = 0;
      shiftBits[2] = 0;
      shiftBits[3] = 0;
      break;
    case VK_FORMAT_B16G16R16G16_422_UNORM:
      bits[0] = 0x10;
      bits[1] = 0x10;
LAB_001e33a8:
      shiftBits[0] = 0;
      shiftBits[1] = 0;
      shiftBits[2] = 0;
      shiftBits[3] = 0;
LAB_001e342c:
      channels[0] = 1;
      channels[1] = 0;
      position_xs[2] = 0x40;
      position_xs[3] = 0xc0;
      goto LAB_001e34d5;
    }
    channels[0] = 0;
    channels[1] = 1;
    position_xs[2] = 0xc0;
    position_xs[3] = 0x40;
LAB_001e34d5:
    position_xs[0] = 0x40;
    position_xs[1] = 0x40;
    position_ys[0] = 0x80;
    position_ys[1] = 0x80;
    position_ys[2] = 0x80;
    position_ys[3] = 0x80;
    puVar1 = createDFD422(0,4,bits,shiftBits,channels,position_xs,position_ys,s_UNORM);
    return puVar1;
  }
  switch(format) {
  case VK_FORMAT_R4G4_UNORM_PACK8:
    channels[0] = 1;
    channels[1] = 0;
    bits[0] = 4;
    bits[1] = 4;
    iVar3 = 2;
    goto LAB_001e2552;
  case VK_FORMAT_R4G4B4A4_UNORM_PACK16:
    channels[0] = 3;
    channels[1] = 2;
    goto LAB_001e251e;
  case VK_FORMAT_B4G4R4A4_UNORM_PACK16:
    channels[0] = 3;
    channels[1] = 0;
LAB_001e251e:
    bits[0] = 4;
    bits[1] = 4;
    goto LAB_001e2545;
  case VK_FORMAT_R5G6B5_UNORM_PACK16:
    channels[0] = 2;
    channels[1] = 1;
    goto LAB_001e267d;
  case VK_FORMAT_B5G6R5_UNORM_PACK16:
    channels[0] = 0;
    channels[1] = 1;
LAB_001e267d:
    bits[0] = 5;
    bits[1] = 6;
    iVar3 = 3;
    goto LAB_001e2552;
  case VK_FORMAT_R5G5B5A1_UNORM_PACK16:
    channels[1] = 2;
    goto LAB_001e3254;
  case VK_FORMAT_B5G5R5A1_UNORM_PACK16:
    channels[1] = 0;
LAB_001e3254:
    channels[0] = 3;
    bits[0] = 1;
    bits[1] = 5;
    goto LAB_001e2545;
  case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
    channels[0] = 2;
LAB_001e2536:
    channels[1] = 1;
    bits[0] = 5;
    bits[1] = 5;
    goto LAB_001e2545;
  case VK_FORMAT_R8_UNORM:
    iVar5 = 1;
    goto LAB_001e281e;
  case VK_FORMAT_R8_SNORM:
    iVar5 = 1;
    goto LAB_001e31d0;
  case VK_FORMAT_R8_USCALED:
    iVar5 = 1;
    goto LAB_001e300a;
  case VK_FORMAT_R8_SSCALED:
    iVar5 = 1;
    goto LAB_001e32ba;
  case VK_FORMAT_R8_UINT:
    iVar5 = 1;
    goto LAB_001e3285;
  case VK_FORMAT_R8_SINT:
    iVar5 = 1;
    goto LAB_001e32a4;
  case VK_FORMAT_R8_SRGB:
    iVar5 = 1;
    goto LAB_001e31fb;
  case VK_FORMAT_R8G8_UNORM:
    iVar5 = 2;
    goto LAB_001e281e;
  case VK_FORMAT_R8G8_SNORM:
    iVar5 = 2;
    goto LAB_001e31d0;
  case VK_FORMAT_R8G8_USCALED:
    iVar5 = 2;
    goto LAB_001e300a;
  case VK_FORMAT_R8G8_SSCALED:
    iVar5 = 2;
    goto LAB_001e32ba;
  case VK_FORMAT_R8G8_UINT:
    iVar5 = 2;
    goto LAB_001e3285;
  case VK_FORMAT_R8G8_SINT:
    iVar5 = 2;
    goto LAB_001e32a4;
  case VK_FORMAT_R8G8_SRGB:
    iVar5 = 2;
    goto LAB_001e31fb;
  case VK_FORMAT_R8G8B8_UNORM:
    iVar5 = 3;
    goto LAB_001e281e;
  case VK_FORMAT_R8G8B8_SNORM:
    iVar5 = 3;
    goto LAB_001e31d0;
  case VK_FORMAT_R8G8B8_USCALED:
    iVar5 = 3;
    goto LAB_001e300a;
  case VK_FORMAT_R8G8B8_SSCALED:
    iVar5 = 3;
    goto LAB_001e32ba;
  case VK_FORMAT_R8G8B8_UINT:
    iVar5 = 3;
    goto LAB_001e3285;
  case VK_FORMAT_R8G8B8_SINT:
    iVar5 = 3;
    goto LAB_001e32a4;
  case VK_FORMAT_R8G8B8_SRGB:
    iVar5 = 3;
    goto LAB_001e31fb;
  case VK_FORMAT_B8G8R8_UNORM:
    iVar5 = 3;
    goto LAB_001e326f;
  case VK_FORMAT_B8G8R8_SNORM:
    iVar5 = 3;
    goto LAB_001e2b49;
  case VK_FORMAT_B8G8R8_USCALED:
    iVar5 = 3;
    goto LAB_001e27c4;
  case VK_FORMAT_B8G8R8_SSCALED:
    iVar5 = 3;
    goto LAB_001e283b;
  case VK_FORMAT_B8G8R8_UINT:
    iVar5 = 3;
    goto LAB_001e302f;
  case VK_FORMAT_B8G8R8_SINT:
    iVar5 = 3;
    goto LAB_001e292e;
  case VK_FORMAT_B8G8R8_SRGB:
    iVar5 = 3;
    goto LAB_001e319a;
  case VK_FORMAT_R8G8B8A8_UNORM:
    iVar5 = 4;
LAB_001e281e:
    iVar4 = 1;
LAB_001e3189:
    iVar3 = 0;
LAB_001e318b:
    VVar6 = s_UNORM;
LAB_001e32c7:
    puVar1 = createDFDUnpacked(0,iVar5,iVar4,iVar3,VVar6);
    return puVar1;
  case VK_FORMAT_R8G8B8A8_SNORM:
    iVar5 = 4;
LAB_001e31d0:
    iVar4 = 1;
LAB_001e3234:
    iVar3 = 0;
LAB_001e3236:
    VVar6 = s_SNORM;
    goto LAB_001e32c7;
  case VK_FORMAT_R8G8B8A8_USCALED:
    iVar5 = 4;
LAB_001e300a:
    iVar4 = 1;
LAB_001e300f:
    iVar3 = 0;
LAB_001e3011:
    VVar6 = s_USCALED;
    goto LAB_001e32c7;
  case VK_FORMAT_R8G8B8A8_SSCALED:
    iVar5 = 4;
LAB_001e32ba:
    iVar4 = 1;
LAB_001e32bf:
    iVar3 = 0;
LAB_001e32c1:
    VVar6 = s_SSCALED;
    goto LAB_001e32c7;
  case VK_FORMAT_R8G8B8A8_UINT:
    iVar5 = 4;
LAB_001e3285:
    iVar4 = 1;
LAB_001e328a:
    iVar3 = 0;
LAB_001e328c:
    VVar6 = s_UINT;
    goto LAB_001e32c7;
  case VK_FORMAT_R8G8B8A8_SINT:
    iVar5 = 4;
LAB_001e32a4:
    iVar4 = 1;
LAB_001e32a9:
    iVar3 = 0;
LAB_001e32ab:
    VVar6 = s_SINT;
    goto LAB_001e32c7;
  case VK_FORMAT_R8G8B8A8_SRGB:
    iVar5 = 4;
LAB_001e31fb:
    iVar3 = 0;
LAB_001e3202:
    iVar4 = 1;
    VVar6 = s_SRGB;
    goto LAB_001e32c7;
  case VK_FORMAT_B8G8R8A8_UNORM:
    iVar5 = 4;
LAB_001e326f:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001e318b;
  case VK_FORMAT_B8G8R8A8_SNORM:
    iVar5 = 4;
LAB_001e2b49:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001e3236;
  case VK_FORMAT_B8G8R8A8_USCALED:
    iVar5 = 4;
LAB_001e27c4:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001e3011;
  case VK_FORMAT_B8G8R8A8_SSCALED:
    iVar5 = 4;
LAB_001e283b:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001e32c1;
  case VK_FORMAT_B8G8R8A8_UINT:
    iVar5 = 4;
LAB_001e302f:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001e328c;
  case VK_FORMAT_B8G8R8A8_SINT:
    iVar5 = 4;
LAB_001e292e:
    iVar4 = 1;
    iVar3 = 1;
    goto LAB_001e32ab;
  case VK_FORMAT_B8G8R8A8_SRGB:
    iVar5 = 4;
LAB_001e319a:
    iVar3 = 1;
    goto LAB_001e3202;
  case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001e2545;
  case VK_FORMAT_A8B8G8R8_SNORM_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001e2efc;
  case VK_FORMAT_A8B8G8R8_USCALED_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001e3089;
  case VK_FORMAT_A8B8G8R8_SSCALED_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001e29bf;
  case VK_FORMAT_A8B8G8R8_UINT_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001e2fc6;
  case VK_FORMAT_A8B8G8R8_SINT_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001e2ece;
  case VK_FORMAT_A8B8G8R8_SRGB_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    channels_00 = channels;
    bits[0] = 8;
    bits[1] = 8;
    iVar3 = 4;
    VVar6 = s_SRGB;
    goto LAB_001e2555;
  case VK_FORMAT_A2R10G10B10_UNORM_PACK32:
    channels[0] = 2;
    goto LAB_001e2e56;
  case VK_FORMAT_A2R10G10B10_SNORM_PACK32:
    channels[0] = 2;
    goto LAB_001e2eed;
  case VK_FORMAT_A2R10G10B10_USCALED_PACK32:
    channels[0] = 2;
    goto LAB_001e307a;
  case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:
    channels[0] = 2;
    goto LAB_001e29b0;
  case VK_FORMAT_A2R10G10B10_UINT_PACK32:
    channels[0] = 2;
    goto LAB_001e2fb7;
  case VK_FORMAT_A2R10G10B10_SINT_PACK32:
    channels[0] = 2;
    goto LAB_001e2ebf;
  case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
    channels[0] = 0;
LAB_001e2e56:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001e2545:
    iVar3 = 4;
LAB_001e2552:
    channels_00 = channels;
    VVar6 = s_UNORM;
    bits_00 = bits;
LAB_001e2555:
    puVar1 = createDFDPacked(0,iVar3,bits_00,channels_00,VVar6);
switchD_001e2591_default:
    return puVar1;
  case VK_FORMAT_A2B10G10R10_SNORM_PACK32:
    channels[0] = 0;
LAB_001e2eed:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001e2efc:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_SNORM;
    bits_00 = bits;
    goto LAB_001e2555;
  case VK_FORMAT_A2B10G10R10_USCALED_PACK32:
    channels[0] = 0;
LAB_001e307a:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001e3089:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_USCALED;
    bits_00 = bits;
    goto LAB_001e2555;
  case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:
    channels[0] = 0;
LAB_001e29b0:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001e29bf:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_SSCALED;
    bits_00 = bits;
    goto LAB_001e2555;
  case VK_FORMAT_A2B10G10R10_UINT_PACK32:
    channels[0] = 0;
LAB_001e2fb7:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001e2fc6:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_UINT;
    bits_00 = bits;
    goto LAB_001e2555;
  case VK_FORMAT_A2B10G10R10_SINT_PACK32:
    channels[0] = 0;
LAB_001e2ebf:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001e2ece:
    channels_00 = channels;
    iVar3 = 4;
    VVar6 = s_SINT;
    bits_00 = bits;
    goto LAB_001e2555;
  case VK_FORMAT_R16_UNORM:
    iVar5 = 1;
    goto LAB_001e3184;
  case VK_FORMAT_R16_SNORM:
    iVar5 = 1;
    goto LAB_001e322f;
  case VK_FORMAT_R16_USCALED:
    iVar5 = 1;
    goto LAB_001e2f1b;
  case VK_FORMAT_R16_SSCALED:
    iVar5 = 1;
    goto LAB_001e31de;
  case VK_FORMAT_R16_UINT:
    iVar5 = 1;
    goto LAB_001e31b6;
  case VK_FORMAT_R16_SINT:
    iVar5 = 1;
    goto LAB_001e3173;
  case VK_FORMAT_R16_SFLOAT:
    iVar5 = 1;
    goto LAB_001e313d;
  case VK_FORMAT_R16G16_UNORM:
    iVar5 = 2;
    goto LAB_001e3184;
  case VK_FORMAT_R16G16_SNORM:
    iVar5 = 2;
    goto LAB_001e322f;
  case VK_FORMAT_R16G16_USCALED:
    iVar5 = 2;
    goto LAB_001e2f1b;
  case VK_FORMAT_R16G16_SSCALED:
    iVar5 = 2;
    goto LAB_001e31de;
  case VK_FORMAT_R16G16_UINT:
    iVar5 = 2;
    goto LAB_001e31b6;
  case VK_FORMAT_R16G16_SINT:
    iVar5 = 2;
    goto LAB_001e3173;
  case VK_FORMAT_R16G16_SFLOAT:
    iVar5 = 2;
    goto LAB_001e313d;
  case VK_FORMAT_R16G16B16_UNORM:
    iVar5 = 3;
    goto LAB_001e3184;
  case VK_FORMAT_R16G16B16_SNORM:
    iVar5 = 3;
    goto LAB_001e322f;
  case VK_FORMAT_R16G16B16_USCALED:
    iVar5 = 3;
    goto LAB_001e2f1b;
  case VK_FORMAT_R16G16B16_SSCALED:
    iVar5 = 3;
    goto LAB_001e31de;
  case VK_FORMAT_R16G16B16_UINT:
    iVar5 = 3;
    goto LAB_001e31b6;
  case VK_FORMAT_R16G16B16_SINT:
    iVar5 = 3;
    goto LAB_001e3173;
  case VK_FORMAT_R16G16B16_SFLOAT:
    iVar5 = 3;
    goto LAB_001e313d;
  case VK_FORMAT_R16G16B16A16_UNORM:
    iVar5 = 4;
LAB_001e3184:
    iVar4 = 2;
    goto LAB_001e3189;
  case VK_FORMAT_R16G16B16A16_SNORM:
    iVar5 = 4;
LAB_001e322f:
    iVar4 = 2;
    goto LAB_001e3234;
  case VK_FORMAT_R16G16B16A16_USCALED:
    iVar5 = 4;
LAB_001e2f1b:
    iVar4 = 2;
    goto LAB_001e300f;
  case VK_FORMAT_R16G16B16A16_SSCALED:
    iVar5 = 4;
LAB_001e31de:
    iVar4 = 2;
    goto LAB_001e32bf;
  case VK_FORMAT_R16G16B16A16_UINT:
    iVar5 = 4;
LAB_001e31b6:
    iVar4 = 2;
    goto LAB_001e328a;
  case VK_FORMAT_R16G16B16A16_SINT:
    iVar5 = 4;
LAB_001e3173:
    iVar4 = 2;
    goto LAB_001e32a9;
  case VK_FORMAT_R16G16B16A16_SFLOAT:
    iVar5 = 4;
LAB_001e313d:
    iVar4 = 2;
LAB_001e3142:
    iVar3 = 0;
    VVar6 = s_SFLOAT;
    goto LAB_001e32c7;
  case VK_FORMAT_R32_UINT:
    iVar5 = 1;
    goto LAB_001e2eae;
  case VK_FORMAT_R32_SINT:
    iVar5 = 1;
    goto LAB_001e2e89;
  case VK_FORMAT_R32_SFLOAT:
    iVar5 = 1;
    goto LAB_001e312f;
  case VK_FORMAT_R32G32_UINT:
    iVar5 = 2;
    goto LAB_001e2eae;
  case VK_FORMAT_R32G32_SINT:
    iVar5 = 2;
    goto LAB_001e2e89;
  case VK_FORMAT_R32G32_SFLOAT:
    iVar5 = 2;
    goto LAB_001e312f;
  case VK_FORMAT_R32G32B32_UINT:
    iVar5 = 3;
    goto LAB_001e2eae;
  case VK_FORMAT_R32G32B32_SINT:
    iVar5 = 3;
    goto LAB_001e2e89;
  case VK_FORMAT_R32G32B32_SFLOAT:
    iVar5 = 3;
    goto LAB_001e312f;
  case VK_FORMAT_R32G32B32A32_UINT:
    iVar5 = 4;
LAB_001e2eae:
    iVar4 = 4;
    goto LAB_001e328a;
  case VK_FORMAT_R32G32B32A32_SINT:
    iVar5 = 4;
LAB_001e2e89:
    iVar4 = 4;
    goto LAB_001e32a9;
  case VK_FORMAT_R32G32B32A32_SFLOAT:
    iVar5 = 4;
LAB_001e312f:
    iVar4 = 4;
    goto LAB_001e3142;
  case VK_FORMAT_R64_UINT:
    iVar5 = 1;
    goto LAB_001e3156;
  case VK_FORMAT_R64_SINT:
    iVar5 = 1;
    goto LAB_001e30c8;
  case VK_FORMAT_R64_SFLOAT:
    iVar5 = 1;
    goto LAB_001e3045;
  case VK_FORMAT_R64G64_UINT:
    iVar5 = 2;
    goto LAB_001e3156;
  case VK_FORMAT_R64G64_SINT:
    iVar5 = 2;
    goto LAB_001e30c8;
  case VK_FORMAT_R64G64_SFLOAT:
    iVar5 = 2;
    goto LAB_001e3045;
  case VK_FORMAT_R64G64B64_UINT:
    iVar5 = 3;
    goto LAB_001e3156;
  case VK_FORMAT_R64G64B64_SINT:
    iVar5 = 3;
    goto LAB_001e30c8;
  case VK_FORMAT_R64G64B64_SFLOAT:
    iVar5 = 3;
    goto LAB_001e3045;
  case VK_FORMAT_R64G64B64A64_UINT:
    iVar5 = 4;
LAB_001e3156:
    iVar4 = 8;
    goto LAB_001e328a;
  case VK_FORMAT_R64G64B64A64_SINT:
    iVar5 = 4;
LAB_001e30c8:
    iVar4 = 8;
    goto LAB_001e32a9;
  case VK_FORMAT_R64G64B64A64_SFLOAT:
    iVar5 = 4;
LAB_001e3045:
    iVar4 = 8;
    goto LAB_001e3142;
  case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
    channels_00 = channels;
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 0xb;
    bits[1] = 0xb;
    iVar3 = 3;
    goto LAB_001e2d01;
  case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
    piVar2 = channels;
    channels = (int  [2])((ulong)channels & 0xffffffff00000000);
    bits = (int  [2])((ulong)bits & 0xffffffff00000000);
    iVar3 = 6;
LAB_001e2d01:
    VVar6 = s_UFLOAT;
    bits_00 = piVar2;
    goto LAB_001e2555;
  case VK_FORMAT_D16_UNORM:
    iVar5 = 0x10;
    iVar4 = 0;
    iVar3 = 2;
    goto LAB_001e305e;
  case VK_FORMAT_X8_D24_UNORM_PACK32:
    iVar5 = 0x18;
    goto LAB_001e2f6c;
  case VK_FORMAT_D32_SFLOAT:
    iVar5 = 0x20;
LAB_001e2f6c:
    iVar4 = 0;
LAB_001e3059:
    iVar3 = 4;
    goto LAB_001e305e;
  case VK_FORMAT_S8_UINT:
    iVar5 = 0;
    iVar4 = 8;
    iVar3 = 1;
    goto LAB_001e305e;
  case VK_FORMAT_D16_UNORM_S8_UINT:
    iVar5 = 0x10;
    goto LAB_001e3054;
  case VK_FORMAT_D24_UNORM_S8_UINT:
    iVar5 = 0x18;
LAB_001e3054:
    iVar4 = 8;
    goto LAB_001e3059;
  case VK_FORMAT_D32_SFLOAT_S8_UINT:
    iVar5 = 0x20;
    iVar4 = 8;
    iVar3 = 8;
LAB_001e305e:
    puVar1 = createDFDDepthStencil(iVar5,iVar4,iVar3);
    return puVar1;
  case VK_FORMAT_BC1_RGB_UNORM_BLOCK:
    compScheme = c_BC1_RGB;
    break;
  case VK_FORMAT_BC1_RGB_SRGB_BLOCK:
    compScheme = c_BC1_RGB;
    goto LAB_001e30aa;
  case VK_FORMAT_BC1_RGBA_UNORM_BLOCK:
    compScheme = c_BC1_RGBA;
    break;
  case VK_FORMAT_BC1_RGBA_SRGB_BLOCK:
    compScheme = c_BC1_RGBA;
    goto LAB_001e30aa;
  case VK_FORMAT_BC2_UNORM_BLOCK:
    compScheme = c_BC2;
    break;
  case VK_FORMAT_BC2_SRGB_BLOCK:
    compScheme = c_BC2;
    goto LAB_001e30aa;
  case VK_FORMAT_BC3_UNORM_BLOCK:
    compScheme = c_BC3;
    break;
  case VK_FORMAT_BC3_SRGB_BLOCK:
    compScheme = c_BC3;
    goto LAB_001e30aa;
  case VK_FORMAT_BC4_UNORM_BLOCK:
    compScheme = c_BC4;
    break;
  case VK_FORMAT_BC4_SNORM_BLOCK:
    compScheme = c_BC4;
    goto LAB_001e2f8c;
  case VK_FORMAT_BC5_UNORM_BLOCK:
    compScheme = c_BC5;
    break;
  case VK_FORMAT_BC5_SNORM_BLOCK:
    compScheme = c_BC5;
    goto LAB_001e2f8c;
  case VK_FORMAT_BC6H_UFLOAT_BLOCK:
    compScheme = c_BC6H;
    iVar5 = 4;
    iVar4 = 4;
    iVar3 = 1;
    VVar6 = s_UFLOAT;
    goto LAB_001e3113;
  case VK_FORMAT_BC6H_SFLOAT_BLOCK:
    compScheme = c_BC6H;
LAB_001e2a6b:
    iVar5 = 4;
LAB_001e2c03:
    iVar4 = 4;
    goto LAB_001e2de4;
  case VK_FORMAT_BC7_UNORM_BLOCK:
    compScheme = c_BC7;
    break;
  case VK_FORMAT_BC7_SRGB_BLOCK:
    compScheme = c_BC7;
    goto LAB_001e30aa;
  case VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK:
    compScheme = c_ETC2_R8G8B8;
    break;
  case VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK:
    compScheme = c_ETC2_R8G8B8;
    goto LAB_001e30aa;
  case VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK:
    compScheme = c_ETC2_R8G8B8A1;
    break;
  case VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK:
    compScheme = c_ETC2_R8G8B8A1;
    goto LAB_001e30aa;
  case VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK:
    compScheme = c_ETC2_R8G8B8A8;
    break;
  case VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK:
    compScheme = c_ETC2_R8G8B8A8;
    goto LAB_001e30aa;
  case VK_FORMAT_EAC_R11_UNORM_BLOCK:
    compScheme = c_EAC_R11;
    break;
  case VK_FORMAT_EAC_R11_SNORM_BLOCK:
    compScheme = c_EAC_R11;
    goto LAB_001e2f8c;
  case VK_FORMAT_EAC_R11G11_UNORM_BLOCK:
    compScheme = c_EAC_R11G11;
    break;
  case VK_FORMAT_EAC_R11G11_SNORM_BLOCK:
    compScheme = c_EAC_R11G11;
LAB_001e2f8c:
    iVar5 = 4;
    iVar4 = 4;
    iVar3 = 1;
    VVar6 = s_SNORM;
    goto LAB_001e3113;
  case VK_FORMAT_ASTC_4x4_UNORM_BLOCK:
    compScheme = c_ASTC;
    break;
  case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
    compScheme = c_ASTC;
LAB_001e30aa:
    iVar5 = 4;
LAB_001e30af:
    iVar4 = 4;
LAB_001e30b4:
    iVar3 = 1;
LAB_001e30b9:
    VVar6 = s_SRGB;
    goto LAB_001e3113;
  case VK_FORMAT_ASTC_5x4_UNORM_BLOCK:
    compScheme = c_ASTC;
    iVar5 = 5;
    goto LAB_001e3106;
  case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
    compScheme = c_ASTC;
    iVar5 = 5;
    goto LAB_001e30af;
  case VK_FORMAT_ASTC_5x5_UNORM_BLOCK:
    iVar5 = 5;
    goto LAB_001e2f7d;
  case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
    iVar5 = 5;
    goto LAB_001e2e9d;
  case VK_FORMAT_ASTC_6x5_UNORM_BLOCK:
    iVar5 = 6;
    goto LAB_001e2f7d;
  case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
    iVar5 = 6;
    goto LAB_001e2e9d;
  case VK_FORMAT_ASTC_6x6_UNORM_BLOCK:
    iVar5 = 6;
    goto LAB_001e2f45;
  case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
    iVar5 = 6;
    goto LAB_001e2db0;
  case VK_FORMAT_ASTC_8x5_UNORM_BLOCK:
    iVar5 = 8;
    goto LAB_001e2f7d;
  case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
    iVar5 = 8;
    goto LAB_001e2e9d;
  case VK_FORMAT_ASTC_8x6_UNORM_BLOCK:
    iVar5 = 8;
    goto LAB_001e2f45;
  case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
    iVar5 = 8;
    goto LAB_001e2db0;
  case VK_FORMAT_ASTC_8x8_UNORM_BLOCK:
    iVar5 = 8;
    goto LAB_001e2d3e;
  case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
    iVar5 = 8;
    goto LAB_001e2d66;
  case VK_FORMAT_ASTC_10x5_UNORM_BLOCK:
    iVar5 = 10;
LAB_001e2f7d:
    compScheme = c_ASTC;
    iVar4 = 5;
    goto LAB_001e310b;
  case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
    iVar5 = 10;
LAB_001e2e9d:
    compScheme = c_ASTC;
    iVar4 = 5;
    goto LAB_001e30b4;
  case VK_FORMAT_ASTC_10x6_UNORM_BLOCK:
    iVar5 = 10;
LAB_001e2f45:
    compScheme = c_ASTC;
    iVar4 = 6;
    goto LAB_001e310b;
  case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
    iVar5 = 10;
LAB_001e2db0:
    compScheme = c_ASTC;
    iVar4 = 6;
    goto LAB_001e30b4;
  case VK_FORMAT_ASTC_10x8_UNORM_BLOCK:
    iVar5 = 10;
LAB_001e2d3e:
    compScheme = c_ASTC;
    iVar4 = 8;
    goto LAB_001e310b;
  case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
    iVar5 = 10;
LAB_001e2d66:
    compScheme = c_ASTC;
    iVar4 = 8;
    goto LAB_001e30b4;
  case VK_FORMAT_ASTC_10x10_UNORM_BLOCK:
    iVar5 = 10;
    goto LAB_001e2cb4;
  case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
    iVar5 = 10;
    goto LAB_001e2b29;
  case VK_FORMAT_ASTC_12x10_UNORM_BLOCK:
    iVar5 = 0xc;
LAB_001e2cb4:
    compScheme = c_ASTC;
    iVar4 = 10;
    goto LAB_001e310b;
  case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
    iVar5 = 0xc;
LAB_001e2b29:
    compScheme = c_ASTC;
    iVar4 = 10;
    goto LAB_001e30b4;
  case VK_FORMAT_ASTC_12x12_UNORM_BLOCK:
    compScheme = c_ASTC;
    iVar5 = 0xc;
    iVar4 = 0xc;
    goto LAB_001e310b;
  case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
    compScheme = c_ASTC;
    iVar5 = 0xc;
    iVar4 = 0xc;
    goto LAB_001e30b4;
  default:
    switch(format) {
    case VK_FORMAT_ASTC_4x4_SFLOAT_BLOCK:
      compScheme = c_ASTC;
      goto LAB_001e2a6b;
    case VK_FORMAT_ASTC_5x4_SFLOAT_BLOCK:
      compScheme = c_ASTC;
      iVar5 = 5;
      goto LAB_001e2c03;
    case VK_FORMAT_ASTC_5x5_SFLOAT_BLOCK:
      iVar5 = 5;
      break;
    case VK_FORMAT_ASTC_6x5_SFLOAT_BLOCK:
      iVar5 = 6;
      break;
    case VK_FORMAT_ASTC_6x6_SFLOAT_BLOCK:
      iVar5 = 6;
      goto LAB_001e2d90;
    case VK_FORMAT_ASTC_8x5_SFLOAT_BLOCK:
      iVar5 = 8;
      break;
    case VK_FORMAT_ASTC_8x6_SFLOAT_BLOCK:
      iVar5 = 8;
      goto LAB_001e2d90;
    case VK_FORMAT_ASTC_8x8_SFLOAT_BLOCK:
      iVar5 = 8;
      goto LAB_001e2dce;
    case VK_FORMAT_ASTC_10x5_SFLOAT_BLOCK:
      iVar5 = 10;
      break;
    case VK_FORMAT_ASTC_10x6_SFLOAT_BLOCK:
      iVar5 = 10;
LAB_001e2d90:
      compScheme = c_ASTC;
      iVar4 = 6;
      goto LAB_001e2de4;
    case VK_FORMAT_ASTC_10x8_SFLOAT_BLOCK:
      iVar5 = 10;
LAB_001e2dce:
      compScheme = c_ASTC;
      iVar4 = 8;
      goto LAB_001e2de4;
    case VK_FORMAT_ASTC_10x10_SFLOAT_BLOCK:
      iVar5 = 10;
      goto LAB_001e2ad9;
    case VK_FORMAT_ASTC_12x10_SFLOAT_BLOCK:
      iVar5 = 0xc;
LAB_001e2ad9:
      compScheme = c_ASTC;
      iVar4 = 10;
      goto LAB_001e2de4;
    case VK_FORMAT_ASTC_12x12_SFLOAT_BLOCK:
      compScheme = c_ASTC;
      iVar5 = 0xc;
      iVar4 = 0xc;
      goto LAB_001e2de4;
    default:
      switch(format) {
      case VK_FORMAT_PVRTC1_2BPP_UNORM_BLOCK_IMG:
        compScheme = c_PVRTC;
        goto LAB_001e2c2a;
      case VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG:
        compScheme = c_PVRTC;
        break;
      case VK_FORMAT_PVRTC2_2BPP_UNORM_BLOCK_IMG:
        compScheme = c_PVRTC2;
LAB_001e2c2a:
        iVar5 = 8;
        goto LAB_001e3106;
      case VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG:
        compScheme = c_PVRTC2;
        break;
      case VK_FORMAT_PVRTC1_2BPP_SRGB_BLOCK_IMG:
        compScheme = c_PVRTC;
        goto LAB_001e2e17;
      case VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG:
        compScheme = c_PVRTC;
        goto LAB_001e30aa;
      case VK_FORMAT_PVRTC2_2BPP_SRGB_BLOCK_IMG:
        compScheme = c_PVRTC2;
LAB_001e2e17:
        iVar5 = 8;
        goto LAB_001e30af;
      case VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG:
        compScheme = c_PVRTC2;
        goto LAB_001e30aa;
      default:
        goto switchD_001e2591_default;
      }
      goto LAB_001e3101;
    }
    compScheme = c_ASTC;
    iVar4 = 5;
LAB_001e2de4:
    iVar3 = 1;
LAB_001e2de9:
    VVar6 = s_SFLOAT;
    goto LAB_001e3113;
  }
LAB_001e3101:
  iVar5 = 4;
LAB_001e3106:
  iVar4 = 4;
LAB_001e310b:
  iVar3 = 1;
LAB_001e3110:
  VVar6 = s_UNORM;
LAB_001e3113:
  puVar1 = createDFDCompressed(compScheme,iVar5,iVar4,iVar3,VVar6);
  return puVar1;
}

Assistant:

uint32_t*
vk2dfd(enum VkFormat format)
 {
     switch (format) {
#include "vk2dfd.inl"
         default: return 0;
     }
 }